

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O0

json_string *
NumberToString::_uitoa<unsigned_long_long>
          (json_string *__return_storage_ptr__,unsigned_long_long val)

{
  undefined1 auVar1 [16];
  unsigned_long uVar2;
  unsigned_long uVar3;
  allocator local_49;
  ulong local_48;
  unsigned_long value;
  char *runner;
  char num_str_result [22];
  unsigned_long_long val_local;
  
  num_str_result[0xd] = '\0';
  local_48 = val;
  value = (unsigned_long)(num_str_result + 0xc);
  do {
    uVar2 = value;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_48;
    uVar3 = value - 1;
    *(char *)value = SUB161(auVar1 % ZEXT816(10),0) + '0';
    local_48 = local_48 / 10;
    value = uVar3;
  } while (local_48 != 0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)uVar2,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return __return_storage_ptr__;
}

Assistant:

static json_string _uitoa(T val) json_nothrow {
		  #ifdef JSON_LESS_MEMORY
			 json_auto<json_char> s(getLenSize<sizeof(T)>::GETLEN);
		  #else
			 json_char num_str_result[getLenSize<sizeof(T)>::GETLEN];
		  #endif
		  num_str_result[getLenSize<sizeof(T)>::GETLEN - 1] = JSON_TEXT('\0'); //null terminator
		  json_char * runner = &num_str_result[getLenSize<sizeof(T)>::GETLEN - 2];

		  //create the string
		  START_MEM_SCOPE
			 unsigned long value = (unsigned long)val;
			 do {
				*runner-- = (json_char)(value % 10) + JSON_TEXT('0');
			 } while(value /= 10);
		  END_MEM_SCOPE

		  return json_string(runner + 1);
	   }